

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool NumberTemp::IsTempUse(Instr *instr,Sym *sym,BackwardPass *backwardPass)

{
  OpCode opcode;
  bool bVar1;
  undefined8 in_RAX;
  IndirOpnd *pIVar2;
  undefined8 uStack_28;
  
  opcode = instr->m_opcode;
  uStack_28 = in_RAX;
  bVar1 = OpCodeAttr::NonTempNumberSources(opcode);
  if (bVar1) {
LAB_005bd2bc:
    if (opcode == StElemI_A) {
      pIVar2 = IR::Opnd::AsIndirOpnd(instr->m_dst);
      uStack_28 = CONCAT26((pIVar2->m_baseOpnd->super_Opnd).m_valueType.field_0.bits,
                           (undefined6)uStack_28);
      bVar1 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)((long)&uStack_28 + 6));
      if (bVar1) goto LAB_005bd2fb;
    }
    bVar1 = false;
  }
  else {
    bVar1 = OpCodeAttr::TempNumberTransfer(opcode);
    if ((bVar1) && ((instr->field_0x36 & 2) == 0)) goto LAB_005bd2bc;
LAB_005bd2fb:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
NumberTemp::IsTempUse(IR::Instr * instr, Sym * sym, BackwardPass * backwardPass)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::NonTempNumberSources(opcode)
        || (OpCodeAttr::TempNumberTransfer(opcode) && !instr->dstIsTempNumber))
    {
        // For TypedArray stores, we don't store the Var object, so MarkTemp is valid
        if (opcode != Js::OpCode::StElemI_A
            || !instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
        {
            // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
            // or it is transferred to a non-temp dst
            return false;
        }
    }
    return true;
}